

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMask.cpp
# Opt level: O2

int __thiscall chrono::ChLinkMask::RestoreRedundant(ChLinkMask *this)

{
  ChConstraintTwoBodies *pCVar1;
  int iVar2;
  int j;
  int i;
  
  iVar2 = 0;
  for (i = 0; i < this->nconstr; i = i + 1) {
    pCVar1 = Constr_N(this,i);
    if ((pCVar1->super_ChConstraintTwo).super_ChConstraint.redundant == true) {
      pCVar1 = Constr_N(this,i);
      (pCVar1->super_ChConstraintTwo).super_ChConstraint.redundant = false;
      ChConstraint::UpdateActiveFlag((ChConstraint *)pCVar1);
      iVar2 = iVar2 + 1;
    }
  }
  return iVar2;
}

Assistant:

int ChLinkMask::RestoreRedundant() {
    int tot = 0;
    for (int j = 0; j < nconstr; j++) {
        if (Constr_N(j).IsRedundant()) {
            Constr_N(j).SetRedundant(false);
            tot++;
        }
    }
    return tot;
}